

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandSimSec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *local_e8;
  Abc_Ntk_t *pNtk1;
  Ssw_Pars_t Pars;
  
  local_e8 = Abc_FrameReadNtk(pAbc);
  Ssw_ManSetDefaultParams(&Pars);
  bVar1 = true;
  Pars.fPartSigCorr = 1;
  Pars.fVerbose = 1;
  Extra_UtilGetoptReset();
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"FDcymvh"), iVar3 = globalUtilOptind, 0x62 < iVar2) {
      if (iVar2 < 0x76) {
        if (iVar2 == 99) {
          Pars.fPartSigCorr = Pars.fPartSigCorr ^ 1;
        }
        else {
          if (iVar2 != 0x6d) goto LAB_0021d003;
          bVar1 = (bool)(bVar1 ^ 1);
        }
      }
      else if (iVar2 == 0x76) {
        Pars.fVerbose = Pars.fVerbose ^ 1;
      }
      else {
        if (iVar2 != 0x79) goto LAB_0021d003;
        Pars.fDumpSRInit = Pars.fDumpSRInit ^ 1;
      }
    }
    if (iVar2 == 0x44) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-D\" should be followed by an integer.\n";
LAB_0021cff7:
        Abc_Print(-1,pcVar4);
        break;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      Pars.nIsleDist = iVar2;
    }
    else {
      if (iVar2 != 0x46) {
        if (iVar2 == -1) {
          if (bVar1) {
            if (local_e8->ntkType == ABC_NTK_STRASH) {
              Abc_NtkDarSimSec(local_e8,(Abc_Ntk_t *)0x0,&Pars);
              return 0;
            }
            pcVar4 = "This command works only for structrally hashed networks. Run \"st\".\n";
          }
          else {
            iVar3 = Abc_NtkPrepareTwoNtks
                              (_stdout,local_e8,argv + globalUtilOptind,argc - globalUtilOptind,
                               &pNtk1,&pNtk2,&fDelete1,&fDelete2);
            if (iVar3 == 0) {
              return 1;
            }
            if ((pNtk1->nObjCounts[8] != 0) && (pNtk2->nObjCounts[8] != 0)) {
              Abc_NtkDarSimSec(pNtk1,pNtk2,&Pars);
              if (fDelete1 != 0) {
                Abc_NtkDelete(pNtk1);
              }
              if (fDelete2 != 0) {
                Abc_NtkDelete(pNtk2);
                return 0;
              }
              return 0;
            }
            if (fDelete1 != 0) {
              Abc_NtkDelete(pNtk1);
            }
            if (fDelete2 != 0) {
              Abc_NtkDelete(pNtk2);
            }
            pcVar4 = "The network has no latches. Used combinational command \"cec\".\n";
          }
          Abc_Print(-1,pcVar4);
          return 0;
        }
        break;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0021cff7;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      Pars.nFramesK = iVar2;
    }
    globalUtilOptind = iVar3 + 1;
  } while (-1 < iVar2);
LAB_0021d003:
  Abc_Print(-2,"usage: simsec [-FD num] [-mcyv] <file1> <file2>\n");
  Abc_Print(-2,"\t         performs SEC using structural similarity\n");
  Abc_Print(-2,"\t-F num : the limit on the depth of induction [default = %d]\n",
            (ulong)(uint)Pars.nFramesK);
  Abc_Print(-2,"\t-D num : the distance for extending islands [default = %d]\n",
            (ulong)(uint)Pars.nIsleDist);
  pcVar4 = "miter";
  if (!bVar1) {
    pcVar4 = "two networks";
  }
  Abc_Print(-2,"\t-m     : toggles miter vs. two networks [default = %s]\n",pcVar4);
  pcVar4 = "partial";
  if (Pars.fPartSigCorr == 0) {
    pcVar4 = "full";
  }
  Abc_Print(-2,"\t-c     : uses partial vs. full signal correspondence [default = %s]\n",pcVar4);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (Pars.fDumpSRInit == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-y     : dumps speculatively reduced miter of the classes [default = %s]\n",pcVar4
           );
  if (Pars.fVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar5);
  Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
  Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
  Abc_Print(-2,"\t         if no files are given, uses the current network and its spec\n");
  Abc_Print(-2,"\t         if one file is given, uses the current network and the file\n");
  return 1;
}

Assistant:

int Abc_CommandSimSec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Ssw_Pars_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2;
    int fDelete1, fDelete2;
    char ** pArgvNew;
    int nArgcNew, c;
    int fMiter;

    extern int Abc_NtkDarSimSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Ssw_Pars_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fMiter = 1;
    Ssw_ManSetDefaultParams( pPars );
    pPars->fPartSigCorr = 1;
    pPars->fVerbose     = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FDcymvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesK = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesK < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIsleDist = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIsleDist < 0 )
                goto usage;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'c':
            pPars->fPartSigCorr ^= 1;
            break;
        case 'y':
            pPars->fDumpSRInit ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( fMiter )
    {
//        Abc_Ntk_t * pNtkA, * pNtkB;
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            Abc_Print( -1, "This command works only for structrally hashed networks. Run \"st\".\n" );
            return 0;
        }
        Abc_NtkDarSimSec( pNtk, NULL, pPars );
/*
        pNtkA = Abc_NtkDup( pNtk );
        pNtkB = Abc_NtkDup( pNtk );
        Abc_NtkDarSimSec( pNtkA, pNtkB, pPars );
        Abc_NtkDelete( pNtkA );
        Abc_NtkDelete( pNtkB );
*/
    }
    else
    {
        pArgvNew = argv + globalUtilOptind;
        nArgcNew = argc - globalUtilOptind;
        if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
            return 1;
        if ( Abc_NtkLatchNum(pNtk1) == 0 || Abc_NtkLatchNum(pNtk2) == 0 )
        {
            if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
            if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
            Abc_Print( -1, "The network has no latches. Used combinational command \"cec\".\n" );
            return 0;
        }
        // perform verification
        Abc_NtkDarSimSec( pNtk1, pNtk2, pPars );
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: simsec [-FD num] [-mcyv] <file1> <file2>\n" );
    Abc_Print( -2, "\t         performs SEC using structural similarity\n" );
    Abc_Print( -2, "\t-F num : the limit on the depth of induction [default = %d]\n", pPars->nFramesK );
    Abc_Print( -2, "\t-D num : the distance for extending islands [default = %d]\n", pPars->nIsleDist );
    Abc_Print( -2, "\t-m     : toggles miter vs. two networks [default = %s]\n", fMiter? "miter": "two networks" );
    Abc_Print( -2, "\t-c     : uses partial vs. full signal correspondence [default = %s]\n", pPars->fPartSigCorr? "partial": "full" );
    Abc_Print( -2, "\t-y     : dumps speculatively reduced miter of the classes [default = %s]\n", pPars->fDumpSRInit? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    Abc_Print( -2, "\t         if no files are given, uses the current network and its spec\n");
    Abc_Print( -2, "\t         if one file is given, uses the current network and the file\n");
    return 1;
}